

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O2

baseType count_time<9,_long>::convert(double t)

{
  baseType bVar1;
  
  bVar1 = 0x7fffffffffffffff;
  if (-9223372036.854765 < t) {
    if (t < 9223372036.854765) {
      bVar1 = (baseType)
              (t * 1000000000.0 + *(double *)(&DAT_00338040 + (ulong)(0.0 <= t * 1000000000.0) * 8))
      ;
    }
    return bVar1;
  }
  return -0x7fffffffffffffff;
}

Assistant:

static constexpr baseType convert(double t) noexcept
    {
        // 10000 is to allow a little wiggle room in the conversion from double
        // the absolute minimum it could be is 1024 to allow for conversion to
        // double of maxVal then back to time,  those should be consistent,
        // supporting float would require a much bigger number
        return (t > toDouble(minVal() + 10000)) ?
            ((t < toDouble(maxVal() - 10000)) ?
                 (quick_round<baseType>(t * dFactor)) :
                 maxVal()) :
            minVal();
    }